

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

void __thiscall
re2::TestInstance::LogMatch
          (TestInstance *this,char *prefix,Engine e,StringPiece *text,StringPiece *context,
          Anchor anchor)

{
  ostream *poVar1;
  MatchKind kind;
  ParseFlags flags;
  StringPiece *src;
  StringPiece *src_00;
  StringPiece *src_01;
  StringPiece *src_02;
  StringPiece SVar2;
  string local_2d0;
  string local_2b0 [32];
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  pointer local_1d0;
  undefined4 local_1c8;
  StringPiece local_1c0;
  LogMessage local_1b0;
  
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
             ,0x239,0);
  poVar1 = std::operator<<((ostream *)&local_1b0.str_,prefix);
  SVar2 = EngineName(e);
  local_1c0.ptr_ = SVar2.ptr_;
  local_1c0.length_ = SVar2.length_;
  poVar1 = operator<<(poVar1,&local_1c0);
  poVar1 = std::operator<<(poVar1," regexp ");
  CEscape_abi_cxx11_(&local_1f0,(re2 *)this->regexp_str_,src);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1," ");
  Regexp::ToString_abi_cxx11_(&local_290,this->regexp_);
  local_1d0 = local_290._M_dataplus._M_p;
  local_1c8 = (undefined4)local_290._M_string_length;
  CEscape_abi_cxx11_(&local_210,(re2 *)&local_1d0,src_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1," text ");
  CEscape_abi_cxx11_(&local_230,(re2 *)text,src_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,") of context ");
  CEscape_abi_cxx11_(&local_250,(re2 *)context,src_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1," (");
  FormatKind_abi_cxx11_(&local_270,(re2 *)(ulong)this->kind_,kind);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,", ");
  if (anchor == kUnanchored) {
    std::__cxx11::string::string(local_2b0,"unanchored",(allocator *)&local_2d0);
  }
  else if (anchor == kAnchored) {
    std::__cxx11::string::string(local_2b0,"anchored",(allocator *)&local_2d0);
  }
  else {
    std::__cxx11::string::string(local_2b0,"???",(allocator *)&local_2d0);
  }
  poVar1 = std::operator<<(poVar1,local_2b0);
  poVar1 = std::operator<<(poVar1,", ");
  FormatMode_abi_cxx11_(&local_2d0,(re2 *)(ulong)this->flags_,flags);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_1f0);
  LogMessage::~LogMessage(&local_1b0);
  return;
}

Assistant:

void TestInstance::LogMatch(const char* prefix, Engine e,
                            const StringPiece& text, const StringPiece& context,
                            Prog::Anchor anchor) {
  LOG(INFO) << prefix
    << EngineName(e)
    << " regexp "
    << CEscape(regexp_str_)
    << " "
    << CEscape(regexp_->ToString())
    << " text "
    << CEscape(text)
    << " ("
    << text.begin() - context.begin()
    << ","
    << text.end() - context.begin()
    << ") of context "
    << CEscape(context)
    << " (" << FormatKind(kind_)
    << ", " << FormatAnchor(anchor)
    << ", " << FormatMode(flags_)
    << ")";
}